

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void * js_realloc2(JSContext *ctx,void *ptr,size_t size,size_t *pslack)

{
  JSRuntime *pJVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  pvVar2 = (*(ctx->rt->mf).js_realloc)(&ctx->rt->malloc_state,ptr,size);
  if (size == 0 || pvVar2 != (void *)0x0) {
    if (pslack != (size_t *)0x0) {
      sVar3 = (*(ctx->rt->mf).js_malloc_usable_size)(pvVar2);
      sVar4 = 0;
      if (size <= sVar3) {
        sVar4 = sVar3 - size;
      }
      *pslack = sVar4;
    }
  }
  else {
    pJVar1 = ctx->rt;
    if (pJVar1->field_0xf0 == '\0') {
      pJVar1->field_0xf0 = 1;
      pvVar2 = (void *)0x0;
      JS_ThrowInternalError(ctx,"out of memory");
      pJVar1->field_0xf0 = 0;
    }
    else {
      pvVar2 = (void *)0x0;
    }
  }
  return pvVar2;
}

Assistant:

void *js_realloc2(JSContext *ctx, void *ptr, size_t size, size_t *pslack)
{
    void *ret;
    ret = js_realloc_rt(ctx->rt, ptr, size);
    if (unlikely(!ret && size != 0)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    if (pslack) {
        size_t new_size = js_malloc_usable_size_rt(ctx->rt, ret);
        *pslack = (new_size > size) ? new_size - size : 0;
    }
    return ret;
}